

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

void __thiscall
World::swap_map_connections
          (World *this,uint16_t map_id_1,uint16_t map_id_2,uint16_t map_id_3,uint16_t map_id_4)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  MapConnection *pMVar5;
  MapConnection *pMVar6;
  uint16_t uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  MapConnection *pMVar11;
  
  pMVar5 = map_connection(this,map_id_1,map_id_2);
  pMVar6 = map_connection(this,map_id_3,map_id_4);
  uVar4 = pMVar5->_map_id_1;
  uVar7 = pMVar6->_map_id_1;
  uVar1 = pMVar5->_pos_x_1;
  uVar2 = pMVar5->_pos_y_1;
  uVar3 = pMVar5->_extra_byte_1;
  if ((uVar7 != map_id_3) == (uVar4 == map_id_1)) {
    pMVar11 = (MapConnection *)&pMVar6->_map_id_2;
    uVar7 = pMVar6->_map_id_2;
    lVar8 = 10;
    lVar9 = 9;
    lVar10 = 8;
  }
  else {
    lVar8 = 4;
    lVar9 = 3;
    lVar10 = 2;
    pMVar11 = pMVar6;
  }
  pMVar5->_map_id_1 = uVar7;
  pMVar5->_pos_x_1 = *(uint8_t *)((long)&pMVar6->_map_id_1 + lVar10);
  pMVar5->_pos_y_1 = *(uint8_t *)((long)&pMVar6->_map_id_1 + lVar9);
  pMVar5->_extra_byte_1 = *(uint8_t *)((long)&pMVar6->_map_id_1 + lVar8);
  pMVar11->_map_id_1 = uVar4;
  *(uint8_t *)((long)&pMVar6->_map_id_1 + lVar10) = uVar1;
  *(uint8_t *)((long)&pMVar6->_map_id_1 + lVar9) = uVar2;
  *(uint8_t *)((long)&pMVar6->_map_id_1 + lVar8) = uVar3;
  return;
}

Assistant:

void World::swap_map_connections(uint16_t map_id_1, uint16_t map_id_2, uint16_t map_id_3, uint16_t map_id_4)
{
    MapConnection& conn_1 = map_connection(map_id_1, map_id_2);
    MapConnection& conn_2 = map_connection(map_id_3, map_id_4);

    bool right_order = true;
    if(conn_1.map_id_1() != map_id_1)
        right_order = !right_order;
    if(conn_2.map_id_1() != map_id_3)
        right_order = !right_order;
    
    uint16_t stored_map_id = conn_1.map_id_1();
    uint8_t stored_pos_x = conn_1.pos_x_1();
    uint8_t stored_pos_y = conn_1.pos_y_1();
    uint8_t stored_extra_byte = conn_1.extra_byte_1();

    if(right_order)
    {
        conn_1.map_id_1(conn_2.map_id_1());
        conn_1.pos_x_1(conn_2.pos_x_1()); 
        conn_1.pos_y_1(conn_2.pos_y_1());
        conn_1.extra_byte_1(conn_2.extra_byte_1());

        conn_2.map_id_1(stored_map_id);
        conn_2.pos_x_1(stored_pos_x); 
        conn_2.pos_y_1(stored_pos_y);
        conn_2.extra_byte_1(stored_extra_byte);
    }
    else
    {
        conn_1.map_id_1(conn_2.map_id_2());
        conn_1.pos_x_1(conn_2.pos_x_2()); 
        conn_1.pos_y_1(conn_2.pos_y_2());
        conn_1.extra_byte_1(conn_2.extra_byte_2());

        conn_2.map_id_2(stored_map_id);
        conn_2.pos_x_2(stored_pos_x); 
        conn_2.pos_y_2(stored_pos_y);
        conn_2.extra_byte_2(stored_extra_byte);
    }
}